

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomInclude::write(DomInclude *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  char16_t *str;
  DomInclude *in_stack_fffffffffffffea8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffeb0;
  QString *pQVar3;
  QString *in_stack_fffffffffffffeb8;
  QString *str_00;
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1a42b9);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"include",7);
    QString::QString((QString *)in_stack_fffffffffffffeb0,(DataPointer *)in_stack_fffffffffffffea8);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffea8->m_text);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a436c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffeb0);
  }
  bVar1 = hasAttributeLocation(this);
  if (bVar1) {
    in_stack_fffffffffffffeb8 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
    attributeLocation(in_stack_fffffffffffffea8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffeb8,local_58);
    QString::~QString((QString *)0x1a442b);
    QString::~QString((QString *)0x1a4438);
  }
  bVar1 = hasAttributeImpldecl(this);
  if (bVar1) {
    pQVar3 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
    attributeImpldecl(in_stack_fffffffffffffea8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar3,local_a8);
    QString::~QString((QString *)0x1a44d8);
    QString::~QString((QString *)0x1a44e5);
  }
  bVar1 = QString::isEmpty((QString *)0x1a44ef);
  if (!bVar1) {
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffeb8);
    QXmlStreamWriter::writeCharacters((QAnyStringView *)pQVar2);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomInclude::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("include") : tagName.toLower());

    if (hasAttributeLocation())
        writer.writeAttribute(u"location"_s, attributeLocation());

    if (hasAttributeImpldecl())
        writer.writeAttribute(u"impldecl"_s, attributeImpldecl());

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}